

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<unsigned_long> *
wasm::WATParser::results<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<unsigned_long> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  ParseDeclsCtx *pPVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Err local_c0;
  Err *local_a0;
  Err *err;
  undefined1 local_88 [8];
  Result<wasm::Ok> _val;
  Result<wasm::Ok> type;
  size_t local_28;
  size_t res;
  ParseDeclsCtx *pPStack_18;
  bool hasAny;
  ParseDeclsCtx *ctx_local;
  
  res._7_1_ = 0;
  pPStack_18 = ctx;
  ctx_local = (ParseDeclsCtx *)__return_storage_ptr__;
  local_28 = NullTypeParserCtx::makeResults((NullTypeParserCtx *)ctx);
  do {
    pPVar1 = pPStack_18;
    expected = sv("result",6);
    bVar2 = Lexer::takeSExprStart(&pPVar1->in,expected);
    if (!bVar2) {
      if ((res._7_1_ & 1) == 0) {
        MaybeResult<unsigned_long>::MaybeResult(__return_storage_ptr__);
      }
      else {
        MaybeResult<unsigned_long>::MaybeResult<unsigned_long>(__return_storage_ptr__,&local_28);
      }
      return __return_storage_ptr__;
    }
    res._7_1_ = 1;
    while (bVar2 = Lexer::takeRParen(&pPStack_18->in), ((bVar2 ^ 0xffU) & 1) != 0) {
      __return_storage_ptr___00 =
           (__index_type *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
      valtype<wasm::WATParser::ParseDeclsCtx>
                ((Result<wasm::Ok> *)__return_storage_ptr___00,pPStack_18);
      Result<wasm::Ok>::Result
                ((Result<wasm::Ok> *)local_88,(Result<wasm::Ok> *)__return_storage_ptr___00);
      local_a0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_88);
      bVar2 = local_a0 != (Err *)0x0;
      if (bVar2) {
        wasm::Err::Err(&local_c0,local_a0);
        MaybeResult<unsigned_long>::MaybeResult(__return_storage_ptr__,&local_c0);
        wasm::Err::~Err(&local_c0);
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_88);
      pPVar1 = pPStack_18;
      if (!bVar2) {
        Result<wasm::Ok>::operator*
                  ((Result<wasm::Ok> *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        NullTypeParserCtx::appendResult((NullTypeParserCtx *)pPVar1,&local_28);
      }
      Result<wasm::Ok>::~Result
                ((Result<wasm::Ok> *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      if (bVar2 && bVar2) {
        return __return_storage_ptr__;
      }
    }
  } while( true );
}

Assistant:

MaybeResult<typename Ctx::ResultsT> results(Ctx& ctx) {
  bool hasAny = false;
  auto res = ctx.makeResults();
  while (ctx.in.takeSExprStart("result"sv)) {
    hasAny = true;
    while (!ctx.in.takeRParen()) {
      auto type = valtype(ctx);
      CHECK_ERR(type);
      ctx.appendResult(res, *type);
    }
  }
  if (hasAny) {
    return res;
  }
  return {};
}